

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_type_handler.h
# Opt level: O3

uint8_t * google::protobuf::internal::
          MapEntryFuncs<long,_proto2_unittest::TestIntIntMap,_(google::protobuf::internal::WireFormatLite::FieldType)16,_(google::protobuf::internal::WireFormatLite::FieldType)11>
          ::InternalSerialize(int field_number,long *key,TestIntIntMap *value,uint8_t *ptr,
                             EpsCopyOutputStream *stream)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  uint8_t *puVar5;
  byte *pbVar6;
  uint uVar7;
  uint uVar8;
  
  if (stream->end_ <= ptr) {
    ptr = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,ptr);
  }
  uVar4 = (ulong)(field_number * 8 + 2);
  if (0x7f < (uint)(field_number << 3)) {
    do {
      uVar8 = (uint)uVar4;
      *ptr = (byte)uVar4 | 0x80;
      uVar4 = uVar4 >> 7;
      ptr = ptr + 1;
    } while (0x3fff < uVar8);
  }
  *ptr = (byte)uVar4;
  pbVar6 = ptr + 1;
  uVar8 = *(uint *)((long)&value->field_0 + 0x30);
  uVar7 = uVar8 | 1;
  iVar3 = 0x1f;
  if (uVar7 != 0) {
    for (; uVar7 >> iVar3 == 0; iVar3 = iVar3 + -1) {
    }
  }
  uVar7 = (iVar3 * 9 + 0x49U >> 6) + uVar8 + 10;
  uVar8 = uVar7;
  if (0x7f < uVar7) {
    do {
      *pbVar6 = (byte)uVar8 | 0x80;
      uVar7 = uVar8 >> 7;
      pbVar6 = pbVar6 + 1;
      bVar2 = 0x3fff < uVar8;
      uVar8 = uVar7;
    } while (bVar2);
  }
  *pbVar6 = (byte)uVar7;
  pbVar6 = pbVar6 + 1;
  if (stream->end_ <= pbVar6) {
    pbVar6 = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,pbVar6);
  }
  lVar1 = *key;
  *pbVar6 = 9;
  *(long *)(pbVar6 + 1) = lVar1;
  pbVar6 = pbVar6 + 9;
  if (stream->end_ <= pbVar6) {
    pbVar6 = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,pbVar6);
  }
  puVar5 = WireFormatLite::InternalWriteMessage
                     (2,(MessageLite *)value,(value->field_0)._impl_._cached_size_.atom_,pbVar6,
                      stream);
  return puVar5;
}

Assistant:

static uint8_t* InternalSerialize(int field_number, const Key& key,
                                    const Value& value, uint8_t* ptr,
                                    io::EpsCopyOutputStream* stream) {
    ptr = stream->EnsureSpace(ptr);
    ptr = WireFormatLite::WriteTagToArray(
        field_number, WireFormatLite::WIRETYPE_LENGTH_DELIMITED, ptr);
    ptr = io::CodedOutputStream::WriteVarint32ToArray(GetCachedSize(key, value),
                                                      ptr);

    ptr = KeyTypeHandler::Write(kKeyFieldNumber, key, ptr, stream);
    return ValueTypeHandler::Write(kValueFieldNumber, value, ptr, stream);
  }